

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

address * __thiscall
libtorrent::aux::torrent_peer::address(address *__return_storage_ptr__,torrent_peer *this)

{
  address_v6 local_30;
  torrent_peer *local_18;
  torrent_peer *this_local;
  
  local_18 = this;
  this_local = (torrent_peer *)__return_storage_ptr__;
  if ((*(uint *)&this->field_0x1b >> 0x18 & 1) == 0) {
    if ((*(uint *)&this->field_0x1b >> 0x19 & 1) == 0) {
      boost::asio::ip::address::address(__return_storage_ptr__,(address_v4 *)(this + 1));
    }
    else {
      boost::asio::ip::address::address(__return_storage_ptr__);
    }
  }
  else {
    boost::asio::ip::address_v6::address_v6(&local_30,(bytes_type *)(this + 1),0);
    boost::asio::ip::address::address(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

libtorrent::address torrent_peer::address() const
	{
		if (is_v6_addr)
			return libtorrent::address_v6(
				static_cast<ipv6_peer const*>(this)->addr);
		else
#if TORRENT_USE_I2P
		if (is_i2p_addr) return {};
		else
#endif
#if TORRENT_USE_RTC
		if (is_rtc_addr) return static_cast<rtc_peer const*>(this)->endpoint.address();
		else
#endif
		return static_cast<ipv4_peer const*>(this)->addr;
	}